

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::UVector(UVector *this,UErrorCode *status)

{
  UErrorCode *status_local;
  UVector *this_local;
  
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__UVector_004b9770;
  this->count = 0;
  this->capacity = 0;
  this->elements = (UElement *)0x0;
  this->deleter = (UObjectDeleter *)0x0;
  this->comparer = (UElementsAreEqual *)0x0;
  _init(this,8,status);
  return;
}

Assistant:

UVector::UVector(UErrorCode &status) :
    count(0),
    capacity(0),
    elements(0),
    deleter(0),
    comparer(0)
{
    _init(DEFAULT_CAPACITY, status);
}